

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

int ps_config_validate(ps_config_t *config)

{
  char *pcVar1;
  size_t sVar2;
  char *msg;
  int local_20;
  int len;
  int found;
  int i;
  ps_config_t *config_local;
  
  local_20 = 0;
  len = 0;
  while ((len < 7 &&
         ((pcVar1 = ps_config_str(config,searches[len]), pcVar1 == (char *)0x0 ||
          (local_20 = local_20 + 1, local_20 < 2))))) {
    len = len + 1;
  }
  if (local_20 < 2) {
    config_local._4_4_ = 0;
  }
  else {
    msg._4_4_ = 0xc;
    for (len = 0; len < 7; len = len + 1) {
      sVar2 = strlen(searches[len]);
      msg._4_4_ = msg._4_4_ + (int)sVar2 + 2;
    }
    pcVar1 = (char *)__ckd_malloc__((long)(msg._4_4_ + 0x24),
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                    ,0x97);
    strcpy(pcVar1,"Only one of ");
    for (len = 0; len < 7; len = len + 1) {
      strcat(pcVar1,searches[len]);
      strcat(pcVar1,", ");
    }
    strcat(pcVar1,"can be enabled at a time in config\n");
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
            ,0x9e,pcVar1);
    ckd_free(pcVar1);
    config_local._4_4_ = -1;
  }
  return config_local._4_4_;
}

Assistant:

int
ps_config_validate(ps_config_t *config)
{
    int i, found = 0;
    for (i = 0; i < nsearches; ++i) {
        if (ps_config_str(config, searches[i]) != NULL)
            if (++found > 1)
                break;
    }
    if (found > 1) {
        int len = strlen("Only one of ");
        char *msg;
        for (i = 0; i < nsearches; ++i)
            len += strlen(searches[i]) + 2;
        len += strlen("can be enabled at a time in config\n");
        msg = ckd_malloc(len + 1);
        strcpy(msg, "Only one of ");
        for (i = 0; i < nsearches; ++i) {
            strcat(msg, searches[i]);
            strcat(msg, ", ");
        }
        strcat(msg, "can be enabled at a time in config\n");
        E_ERROR(msg);
        ckd_free(msg);
        return -1;
    }
    return 0;
}